

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

int __thiscall QListView::visualIndex(QListView *this,QModelIndex *index)

{
  QListViewPrivate *this_00;
  ulong uVar1;
  int iVar2;
  int iVar3;
  Data *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  uint local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  QListViewPrivate::indexToListViewItem((QListViewItem *)local_48,this_00,index);
  iVar2 = (*this_00->commonListView->_vptr_QCommonListViewBase[2])(this_00->commonListView,local_48)
  ;
  pDVar4 = (this_00->hiddenRows).q_hash.d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar5 = 0;
LAB_00568f8a:
    if (pDVar4 == (Data *)0x0 && uVar5 == 0) goto LAB_0056900c;
  }
  else {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar1 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_00568f8a;
    }
    uVar5 = 0;
  }
  do {
    iVar3 = QPersistentModelIndex::row();
    iVar2 = iVar2 - (uint)(iVar3 <= index->r);
    do {
      if (pDVar4->numBuckets - 1 == uVar5) {
        pDVar4 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  } while ((pDVar4 != (Data *)0x0) || (uVar5 != 0));
LAB_0056900c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QListView::visualIndex(const QModelIndex &index) const
{
    Q_D(const QListView);
    d->executePostedLayout();
    QListViewItem itm = d->indexToListViewItem(index);
    int visualIndex = d->commonListView->itemIndex(itm);
    for (const auto &idx : std::as_const(d->hiddenRows)) {
        if (idx.row() <= index.row())
            --visualIndex;
    }
    return visualIndex;
}